

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
sentencepiece::util::StrSplitAsCSV_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,util *this,string_view text)

{
  util *puVar1;
  util *puVar2;
  size_t sVar3;
  util *__s;
  util *puVar4;
  util *puVar5;
  util *puVar6;
  string buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  util *local_50 [2];
  long local_40 [2];
  
  local_50[0] = (util *)local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,text._M_len,this + text._M_len,text._M_str);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < (long)this) {
    puVar6 = this + (long)local_50[0];
    __s = local_50[0];
    do {
      if (*__s == (util)0x22) {
        __s = __s + 1;
        puVar5 = __s;
        for (puVar2 = __s;
            (puVar4 = puVar2, puVar2 < puVar6 &&
            ((*puVar2 != (util)0x22 ||
             (puVar4 = puVar2 + 1, puVar1 = puVar2 + 1, puVar2 = puVar4, *puVar1 == (util)0x22))));
            puVar2 = puVar2 + 1) {
          *puVar5 = *puVar2;
          puVar5 = puVar5 + 1;
        }
        local_70._M_dataplus._M_p._0_1_ = 0x2c;
        puVar2 = (util *)std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                   (puVar4,puVar6,&local_70);
      }
      else {
        local_70._M_dataplus._M_p._0_1_ = 0x2c;
        puVar5 = (util *)std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                   (__s,puVar6,&local_70);
        puVar2 = puVar5;
      }
      *puVar5 = (util)0x0;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      sVar3 = strlen((char *)__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,__s,__s + sVar3);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      __s = puVar2 + 1;
    } while (__s < puVar6);
  }
  if (local_50[0] != (util *)local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> StrSplitAsCSV(absl::string_view text) {
  std::string buf = std::string(text);
  char *str = const_cast<char *>(buf.data());
  char *eos = str + text.size();
  char *start = nullptr;
  char *end = nullptr;

  std::vector<std::string> result;
  for (; str < eos; ++str) {
    if (*str == '"') {
      start = ++str;
      end = start;
      for (; str < eos; ++str) {
        if (*str == '"') {
          str++;
          if (*str != '"') break;
        }
        *end++ = *str;
      }
      str = std::find(str, eos, ',');
    } else {
      start = str;
      str = std::find(str, eos, ',');
      end = str;
    }
    *end = '\0';
    result.push_back(start);
  }

  return result;
}